

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O0

void phmap::priv::map_slot_policy<int,int>::
     construct<phmap::priv::Alloc<std::pair<int_const,int>>,std::piecewise_construct_t_const&,std::tuple<int_const&>,std::tuple<>>
               (Alloc<std::pair<const_int,_int>_> *alloc,slot_type *slot,piecewise_construct_t *args
               ,tuple<const_int_&> *args_1,tuple<> *args_2)

{
  tuple<> *args_local_2;
  tuple<const_int_&> *args_local_1;
  piecewise_construct_t *args_local;
  slot_type *slot_local;
  Alloc<std::pair<const_int,_int>_> *alloc_local;
  
  map_slot_policy<int,_int>::emplace(slot);
  allocator_traits<phmap::priv::Alloc<std::pair<int_const,int>>>::
  construct<std::pair<int,int>,std::piecewise_construct_t_const&,std::tuple<int_const&>,std::tuple<>>
            (alloc,(pair<int,_int> *)&slot->value,args,args_1,args_2);
  return;
}

Assistant:

static void construct(Allocator* alloc, slot_type* slot, Args&&... args) {
        emplace(slot);
        if (kMutableKeys::value) {
            phmap::allocator_traits<Allocator>::construct(*alloc, &slot->mutable_value,
                                                         std::forward<Args>(args)...);
        } else {
            phmap::allocator_traits<Allocator>::construct(*alloc, &slot->value,
                                                         std::forward<Args>(args)...);
        }
    }